

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

float __thiscall pbrt::SampledGrid<float>::MaximumValue(SampledGrid<float> *this,Bounds3f *bounds)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int z;
  uint uVar12;
  int x;
  ulong uVar13;
  int y;
  undefined1 auVar14 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar18 [16];
  undefined1 in_ZMM5 [64];
  float local_5c;
  Tuple3<pbrt::Point3,_int> local_50;
  ulong local_40;
  ulong local_38;
  undefined1 extraout_var [60];
  
  auVar14._0_4_ = (float)this->nx;
  auVar14._4_12_ = in_ZMM0._4_12_;
  iVar6 = this->nx + -1;
  auVar17._0_4_ = (float)this->ny;
  auVar17._4_12_ = in_ZMM3._4_12_;
  auVar18._0_4_ = (float)this->nz;
  auVar18._4_12_ = in_ZMM5._4_12_;
  auVar16 = SUB6416(ZEXT464(0xbf000000),0);
  auVar1 = vfmadd132ss_fma(ZEXT416((uint)(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x),auVar16
                           ,auVar14);
  auVar2 = vfmadd132ss_fma(auVar14,auVar16,
                           ZEXT416((uint)(bounds->pMax).super_Tuple3<pbrt::Point3,_float>.x));
  iVar9 = this->ny + -1;
  iVar10 = this->nz + -1;
  auVar14 = vfmadd132ss_fma(ZEXT416((uint)(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y),
                            auVar16,auVar17);
  auVar3 = vfmadd132ss_fma(ZEXT416((uint)(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z),auVar16
                           ,auVar18);
  auVar17 = vfmadd132ss_fma(auVar17,auVar16,
                            ZEXT416((uint)(bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y));
  auVar16 = vfmadd132ss_fma(auVar18,auVar16,
                            ZEXT416((uint)(bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z));
  auVar1 = vroundss_avx(auVar1,auVar1,9);
  auVar14 = vroundss_avx(auVar14,auVar14,9);
  auVar3 = vroundss_avx(auVar3,auVar3,9);
  auVar2 = vroundss_avx(auVar2,auVar2,9);
  auVar17 = vroundss_avx(auVar17,auVar17,9);
  auVar16 = vroundss_avx(auVar16,auVar16,9);
  iVar11 = (int)auVar2._0_4_ + 1;
  uVar7 = ~((int)auVar1._0_4_ >> 0x1f) & (int)auVar1._0_4_;
  local_38 = (ulong)uVar7;
  uVar4 = ~((int)auVar14._0_4_ >> 0x1f) & (int)auVar14._0_4_;
  local_40 = (ulong)uVar4;
  uVar12 = ~((int)auVar3._0_4_ >> 0x1f) & (int)auVar3._0_4_;
  local_50.y = uVar4;
  local_50.x = uVar7;
  iVar5 = (int)auVar17._0_4_ + 1;
  iVar8 = (int)auVar16._0_4_ + 1;
  if (iVar11 <= iVar6) {
    iVar6 = iVar11;
  }
  if (iVar5 <= iVar9) {
    iVar9 = iVar5;
  }
  if (iVar8 <= iVar10) {
    iVar10 = iVar8;
  }
  local_50.z = uVar12;
  local_5c = Lookup(this,(Point3i *)&local_50);
  for (; (int)uVar12 <= iVar10; uVar12 = uVar12 + 1) {
    uVar13 = local_40 & 0xffffffff;
    while (iVar5 = (int)uVar13, iVar5 <= iVar9) {
      uVar13 = local_38 & 0xffffffff;
      while (iVar8 = (int)uVar13, iVar8 <= iVar6) {
        local_50.y = iVar5;
        local_50.x = iVar8;
        local_50.z = uVar12;
        auVar15._0_4_ = Lookup(this,(Point3i *)&local_50);
        auVar15._4_60_ = extraout_var;
        uVar13 = (ulong)(iVar8 + 1);
        auVar1 = vmaxss_avx(auVar15._0_16_,ZEXT416((uint)local_5c));
        local_5c = auVar1._0_4_;
      }
      uVar13 = (ulong)(iVar5 + 1);
    }
  }
  return local_5c;
}

Assistant:

T MaximumValue(const Bounds3f &bounds) const {
        Point3f ps[2] = {Point3f(bounds.pMin.x * nx - .5f, bounds.pMin.y * ny - .5f,
                                 bounds.pMin.z * nz - .5f),
                         Point3f(bounds.pMax.x * nx - .5f, bounds.pMax.y * ny - .5f,
                                 bounds.pMax.z * nz - .5f)};
        Point3i pi[2] = {Max(Point3i(Floor(ps[0])), Point3i(0, 0, 0)),
                         Min(Point3i(Floor(ps[1])) + Vector3i(1, 1, 1),
                             Point3i(nx - 1, ny - 1, nz - 1))};

        T maxValue = Lookup(Point3i(pi[0]));
        for (int z = pi[0].z; z <= pi[1].z; ++z)
            for (int y = pi[0].y; y <= pi[1].y; ++y)
                for (int x = pi[0].x; x <= pi[1].x; ++x) {
                    using std::max;
                    maxValue = max(maxValue, Lookup(Point3i(x, y, z)));
                }

        return maxValue;
    }